

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

DefaultConfigRuleSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::DefaultConfigRuleSyntax,slang::parsing::Token,slang::syntax::ConfigLiblistSyntax&,slang::parsing::Token>
          (BumpAllocator *this,Token *args,ConfigLiblistSyntax *args_1,Token *args_2)

{
  Info *pIVar1;
  Info *pIVar2;
  TokenKind TVar3;
  undefined1 uVar4;
  NumericTokenFlags NVar5;
  uint32_t uVar6;
  TokenKind TVar7;
  undefined1 uVar8;
  NumericTokenFlags NVar9;
  uint32_t uVar10;
  DefaultConfigRuleSyntax *pDVar11;
  
  pDVar11 = (DefaultConfigRuleSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((DefaultConfigRuleSyntax *)this->endPtr < pDVar11 + 1) {
    pDVar11 = (DefaultConfigRuleSyntax *)allocateSlow(this,0x40,8);
  }
  else {
    this->head->current = (byte *)(pDVar11 + 1);
  }
  TVar3 = args->kind;
  uVar4 = args->field_0x2;
  NVar5.raw = (args->numFlags).raw;
  uVar6 = args->rawLen;
  pIVar1 = args->info;
  TVar7 = args_2->kind;
  uVar8 = args_2->field_0x2;
  NVar9.raw = (args_2->numFlags).raw;
  uVar10 = args_2->rawLen;
  pIVar2 = args_2->info;
  (pDVar11->super_ConfigRuleSyntax).super_SyntaxNode.kind = DefaultConfigRule;
  (pDVar11->super_ConfigRuleSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (pDVar11->super_ConfigRuleSyntax).super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  (pDVar11->defaultKeyword).kind = TVar3;
  (pDVar11->defaultKeyword).field_0x2 = uVar4;
  (pDVar11->defaultKeyword).numFlags = (NumericTokenFlags)NVar5.raw;
  (pDVar11->defaultKeyword).rawLen = uVar6;
  (pDVar11->defaultKeyword).info = pIVar1;
  (pDVar11->liblist).ptr = args_1;
  (pDVar11->semi).kind = TVar7;
  (pDVar11->semi).field_0x2 = uVar8;
  (pDVar11->semi).numFlags = (NumericTokenFlags)NVar9.raw;
  (pDVar11->semi).rawLen = uVar10;
  (pDVar11->semi).info = pIVar2;
  (args_1->super_ConfigRuleClauseSyntax).super_SyntaxNode.parent = (SyntaxNode *)pDVar11;
  return pDVar11;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }